

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void suboption(connectdata *conn)

{
  char cVar1;
  SessionHandle *data;
  char *pcVar2;
  FormData *pFVar3;
  FormData *__s;
  size_t sVar4;
  ssize_t sVar5;
  uint *puVar6;
  size_t length;
  ulong uVar7;
  HTTP *pHVar8;
  undefined8 uStackY_970;
  undefined8 in_stack_fffffffffffff698;
  uint uVar9;
  char varval [128];
  char varname [128];
  uchar temp [2048];
  
  uVar9 = (uint)((ulong)in_stack_fffffffffffff698 >> 0x20);
  data = conn->data;
  pHVar8 = (data->state).proto.http;
  printsub(data,0x3c,(uchar *)&pHVar8[0x36].postsize,
           (*(long *)&pHVar8[0x39].sending - pHVar8[0x39].backup.postsize) + 2);
  pcVar2 = (char *)pHVar8[0x39].backup.postsize;
  pHVar8[0x39].backup.postsize = (curl_off_t)(pcVar2 + 1);
  cVar1 = *pcVar2;
  if (cVar1 == '\'') {
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c",0xff,0xfa,0x27,(ulong)uVar9 << 0x20);
    pHVar8 = pHVar8 + 0x36;
    length = 4;
    while( true ) {
      pFVar3 = pHVar8->sendit;
      if (pFVar3 == (FormData *)0x0) break;
      __s = pFVar3->next;
      sVar4 = strlen((char *)__s);
      uVar7 = sVar4 + length + 1;
      if (uVar7 < 0x7fa) {
        __isoc99_sscanf(__s,"%127[^,],%127s",varname,varval);
        curl_msnprintf((char *)(temp + length),0x800 - length,"%c%s%c%s",0,varname,1,varval);
        length = uVar7;
      }
      pHVar8 = (HTTP *)&pFVar3->type;
    }
    curl_msnprintf((char *)(temp + length),0x800 - length,"%c%c",0xff,0xf0);
    sVar5 = send(conn->sock[0],temp,length + 2,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar6);
    }
  }
  else {
    if (cVar1 == '#') {
      pHVar8 = pHVar8 + 0x35;
      sVar4 = strlen((char *)pHVar8);
      uStackY_970 = 0x23;
    }
    else {
      if (cVar1 != '\x18') {
        return;
      }
      pHVar8 = (HTTP *)&pHVar8[0x34].backup.postdata;
      sVar4 = strlen((char *)pHVar8);
      uStackY_970 = 0x18;
    }
    length = sVar4 + 4;
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,uStackY_970,(ulong)uVar9 << 0x20,
                   pHVar8,0xff,0xf0);
    sVar5 = send(conn->sock[0],temp,sVar4 + 6,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar6);
    }
  }
  printsub(data,0x3e,temp + 2,length);
  return;
}

Assistant:

static void suboption(struct connectdata *conn)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  size_t tmplen;
  int err;
  char varname[128];
  char varval[128];
  struct SessionHandle *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->state.proto.telnet;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn)+2);
  switch (CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
               CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
               CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      snprintf((char *)temp, sizeof(temp),
               "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
               CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars;v;v = v->next) {
        tmplen = (strlen(v->data) + 1);
        /* Add the variable only if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          sscanf(v->data, "%127[^,],%127s", varname, varval);
          snprintf((char *)&temp[len], sizeof(temp) - len,
                   "%c%s%c%s", CURL_NEW_ENV_VAR, varname,
                   CURL_NEW_ENV_VALUE, varval);
          len += tmplen;
        }
      }
      snprintf((char *)&temp[len], sizeof(temp) - len,
               "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}